

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

void SetCloseOnExec(int fd)

{
  uint uVar1;
  int iVar2;
  int flags;
  int fd_local;
  
  uVar1 = fcntl(fd,1);
  if ((int)uVar1 < 0) {
    perror("fcntl(F_GETFD)");
  }
  else {
    iVar2 = fcntl(fd,2,(ulong)(uVar1 | 1));
    if (iVar2 < 0) {
      perror("fcntl(F_SETFD)");
    }
  }
  return;
}

Assistant:

void SetCloseOnExec(int fd) {
#ifndef _WIN32
  int flags = fcntl(fd, F_GETFD);
  if (flags < 0) {
    perror("fcntl(F_GETFD)");
  } else {
    if (fcntl(fd, F_SETFD, flags | FD_CLOEXEC) < 0)
      perror("fcntl(F_SETFD)");
  }
#else
  HANDLE hd = (HANDLE) _get_osfhandle(fd);
  if (! SetHandleInformation(hd, HANDLE_FLAG_INHERIT, 0)) {
    fprintf(stderr, "SetHandleInformation(): %s", GetLastErrorString().c_str());
  }
#endif  // ! _WIN32
}